

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pillar.cpp
# Opt level: O1

void __thiscall
DPillar::DPillar(DPillar *this,sector_t *sector,EPillar type,double speed,double floordist,
                double ceilingdist,int crush,bool hexencrush)

{
  DInterpolation *pDVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  vertex_t *spot;
  double local_50;
  vertex_t *local_40;
  double local_38;
  FName local_2c;
  
  local_38 = ceilingdist;
  DMover::DMover(&this->super_DMover,sector);
  (this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_0084b458;
  (sector->ceilingdata).field_0.p = (DSectorEffect *)this;
  (sector->floordata).field_0.p = (DSectorEffect *)this;
  pDVar1 = sector_t::SetInterpolation(sector,1,true);
  (this->m_Interp_Floor).field_0.p = pDVar1;
  pDVar1 = sector_t::SetInterpolation(sector,0,true);
  (this->m_Interp_Ceiling).field_0.p = pDVar1;
  this->m_Type = type;
  this->m_Crush = crush;
  this->m_Hexencrush = hexencrush;
  local_50 = floordist;
  if (type == pillarBuild) {
    dVar2 = (sector->centerspot).X;
    dVar5 = (sector->centerspot).Y;
    dVar4 = (sector->floorplane).normal.X * dVar2;
    dVar6 = ((sector->floorplane).normal.Y * dVar5 + (sector->floorplane).D + dVar4) *
            (sector->floorplane).negiC;
    if ((floordist != 0.0) || (NAN(floordist))) {
      dVar3 = dVar6 + floordist;
      dVar5 = (sector->centerspot).Y;
      this->m_FloorTarget =
           -((sector->floorplane).normal.Z * dVar3 + dVar4 + (sector->floorplane).normal.Y * dVar5);
      this->m_CeilingTarget =
           -((sector->ceilingplane).normal.Z * dVar3 +
            dVar5 * (sector->ceilingplane).normal.Y + dVar2 * (sector->ceilingplane).normal.X);
    }
    else {
      dVar2 = dVar2 * (sector->ceilingplane).normal.X;
      dVar3 = ((dVar5 * (sector->ceilingplane).normal.Y + (sector->ceilingplane).D + dVar2) *
               (sector->ceilingplane).negiC + dVar6) * 0.5;
      dVar5 = (sector->centerspot).Y;
      this->m_FloorTarget =
           -((sector->floorplane).normal.Z * dVar3 + dVar4 + (sector->floorplane).normal.Y * dVar5);
      this->m_CeilingTarget =
           -((sector->ceilingplane).normal.Z * dVar3 +
            dVar5 * (sector->ceilingplane).normal.Y + dVar2);
      local_50 = dVar3 - dVar6;
    }
    dVar3 = ((sector->ceilingplane).normal.Y * (sector->centerspot).Y +
            (sector->ceilingplane).normal.X * (sector->centerspot).X + (sector->ceilingplane).D) *
            (sector->ceilingplane).negiC - dVar3;
  }
  else {
    if ((floordist != 0.0) || (NAN(floordist))) {
      dVar2 = (sector->floorplane).normal.X * (sector->centerspot).X;
      dVar5 = (sector->floorplane).normal.Y * (sector->centerspot).Y;
      this->m_FloorTarget =
           -((((sector->floorplane).D + dVar2 + dVar5) * (sector->floorplane).negiC - floordist) *
             (sector->floorplane).normal.Z + dVar5 + dVar2);
    }
    else {
      local_50 = sector_t::FindLowestFloorSurrounding(sector,&local_40);
      dVar5 = (sector->floorplane).normal.X * (local_40->p).X;
      dVar2 = (sector->floorplane).normal.Y * (local_40->p).Y;
      this->m_FloorTarget = -((sector->floorplane).normal.Z * local_50 + dVar5 + dVar2);
      local_50 = (dVar5 + (sector->floorplane).D + dVar2) * (sector->floorplane).negiC - local_50;
    }
    if ((local_38 != 0.0) || (NAN(local_38))) {
      dVar2 = (sector->ceilingplane).normal.X * (sector->centerspot).X;
      dVar5 = (sector->ceilingplane).normal.Y * (sector->centerspot).Y;
      this->m_CeilingTarget =
           -((((sector->ceilingplane).D + dVar2 + dVar5) * (sector->ceilingplane).negiC + local_38)
             * (sector->ceilingplane).normal.Z + dVar5 + dVar2);
      dVar3 = local_38;
    }
    else {
      dVar2 = sector_t::FindHighestCeilingSurrounding(sector,&local_40);
      dVar6 = (sector->ceilingplane).normal.X * (local_40->p).X;
      dVar5 = (sector->ceilingplane).normal.Y * (local_40->p).Y;
      this->m_CeilingTarget = -((sector->ceilingplane).normal.Z * dVar2 + dVar6 + dVar5);
      dVar3 = dVar2 - (dVar6 + (sector->ceilingplane).D + dVar5) * (sector->ceilingplane).negiC;
    }
  }
  dVar5 = local_50;
  dVar2 = dVar3;
  if (local_50 <= dVar3) {
    dVar5 = dVar3;
    dVar2 = local_50;
  }
  (&this->m_FloorSpeed)[local_50 <= dVar3] = speed;
  (&this->m_FloorSpeed)[dVar3 < local_50] = (dVar2 * speed) / dVar5;
  if ((((this->super_DMover).super_DSectorEffect.m_Sector)->Flags & 0x40) == 0) {
    if (sector->seqType < 0) {
      local_2c.Index = (sector->SeqName).super_FName.Index;
      if (local_2c.Index == 0) {
        SN_StartSequence(sector,1,"Floor",0);
      }
      else {
        SN_StartSequence(sector,1,&local_2c,0);
      }
    }
    else {
      SN_StartSequence(sector,1,(int)sector->seqType,SEQ_PLATFORM,0,false);
    }
  }
  return;
}

Assistant:

DPillar::DPillar (sector_t *sector, EPillar type, double speed,
				  double floordist, double ceilingdist, int crush, bool hexencrush)
	: DMover (sector)
{
	double newheight;
	vertex_t *spot;

	sector->floordata = sector->ceilingdata = this;
	m_Interp_Floor = sector->SetInterpolation(sector_t::FloorMove, true);
	m_Interp_Ceiling = sector->SetInterpolation(sector_t::CeilingMove, true);

	m_Type = type;
	m_Crush = crush;
	m_Hexencrush = hexencrush;

	if (type == pillarBuild)
	{
		// If the pillar height is 0, have the floor and ceiling meet halfway
		if (floordist == 0)
		{
			newheight = (sector->CenterFloor () + sector->CenterCeiling ()) / 2;
			m_FloorTarget = sector->floorplane.PointToDist (sector->centerspot, newheight);
			m_CeilingTarget = sector->ceilingplane.PointToDist (sector->centerspot, newheight);
			floordist = newheight - sector->CenterFloor ();
		}
		else
		{
			newheight = sector->CenterFloor () + floordist;
			m_FloorTarget = sector->floorplane.PointToDist (sector->centerspot, newheight);
			m_CeilingTarget = sector->ceilingplane.PointToDist (sector->centerspot, newheight);
		}
		ceilingdist = sector->CenterCeiling () - newheight;
	}
	else
	{
		// If one of the heights is 0, figure it out based on the
		// surrounding sectors
		if (floordist == 0)
		{
			newheight = sector->FindLowestFloorSurrounding (&spot);
			m_FloorTarget = sector->floorplane.PointToDist (spot, newheight);
			floordist = sector->floorplane.ZatPoint (spot) - newheight;
		}
		else
		{
			newheight = sector->CenterFloor() - floordist;
			m_FloorTarget = sector->floorplane.PointToDist (sector->centerspot, newheight);
		}
		if (ceilingdist == 0)
		{
			newheight = sector->FindHighestCeilingSurrounding (&spot);
			m_CeilingTarget = sector->ceilingplane.PointToDist (spot, newheight);
			ceilingdist = newheight - sector->ceilingplane.ZatPoint (spot);
		}
		else
		{
			newheight = sector->CenterCeiling() + ceilingdist;
			m_CeilingTarget = sector->ceilingplane.PointToDist (sector->centerspot, newheight);
		}
	}

	// The speed parameter applies to whichever part of the pillar
	// travels the farthest. The other part's speed is then set so
	// that it arrives at its destination at the same time.
	if (floordist > ceilingdist)
	{
		m_FloorSpeed = speed;
		m_CeilingSpeed = speed * ceilingdist / floordist;
	}
	else
	{
		m_CeilingSpeed = speed;
		m_FloorSpeed = speed * floordist / ceilingdist;
	}

	if (!(m_Sector->Flags & SECF_SILENTMOVE))
	{
		if (sector->seqType >= 0)
		{
			SN_StartSequence(sector, CHAN_FLOOR, sector->seqType, SEQ_PLATFORM, 0);
		}
		else if (sector->SeqName != NAME_None)
		{
			SN_StartSequence(sector, CHAN_FLOOR, sector->SeqName, 0);
		}
		else
		{
			SN_StartSequence(sector, CHAN_FLOOR, "Floor", 0);
		}
	}
}